

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

void __thiscall
chrono::viper::ViperLowerArm::ViperLowerArm
          (ViperLowerArm *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,int *side)

{
  ChColor local_58 [2];
  shared_ptr<chrono::ChMaterialSurface> local_40;
  int *local_30;
  int *side_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  ChFrame<double> *rel_pos_local;
  string *name_local;
  ViperLowerArm *this_local;
  
  local_30 = side;
  side_local = (int *)mat;
  mat_local = (shared_ptr<chrono::ChMaterialSurface> *)rel_pos;
  rel_pos_local = (ChFrame<double> *)name;
  name_local = (string *)this;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_40,mat);
  ViperPart::ViperPart(&this->super_ViperPart,name,rel_pos,&local_40,false);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_40);
  (this->super_ViperPart)._vptr_ViperPart = (_func_int **)&PTR__ViperLowerArm_002eef30;
  if (*local_30 == 0) {
    std::__cxx11::string::operator=((string *)&(this->super_ViperPart).m_mesh_name,"viper_L_bt_sus")
    ;
  }
  else if (*local_30 == 1) {
    std::__cxx11::string::operator=((string *)&(this->super_ViperPart).m_mesh_name,"viper_R_bt_sus")
    ;
  }
  ChColor::ChColor(local_58,0.7,0.4,0.4);
  ChColor::operator=(&(this->super_ViperPart).m_color,local_58);
  ViperPart::CalcMassProperties(&this->super_ViperPart,4500.0);
  return;
}

Assistant:

ViperLowerArm::ViperLowerArm(const std::string& name,
                             const ChFrame<>& rel_pos,
                             std::shared_ptr<ChMaterialSurface> mat,
                             const int& side)
    : ViperPart(name, rel_pos, mat, false) {
    if (side == 0) {
        m_mesh_name = "viper_L_bt_sus";
    } else if (side == 1) {
        m_mesh_name = "viper_R_bt_sus";
    }

    m_color = ChColor(0.7f, 0.4f, 0.4f);
    CalcMassProperties(4500);
}